

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

StringTree * __thiscall
kj::StringTree::concat<kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,ArrayPtr<const_char> *params,
          StringTree *params_1,ArrayPtr<const_char> *params_2)

{
  size_t sVar1;
  size_type extraout_RDX;
  size_type extraout_RDX_00;
  char *pos;
  initializer_list<unsigned_long> nums;
  initializer_list<unsigned_long> nums_00;
  initializer_list<unsigned_long> nums_01;
  Array<kj::StringTree::Branch> local_58;
  char *local_40;
  undefined8 local_38;
  char *local_30;
  
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->text).content.size_ = 0;
  local_58.ptr = (Branch *)(this->text).content.ptr;
  local_58.size_ = (size_t)params->ptr;
  local_58.disposer = (ArrayDisposer *)(params_1->text).content.ptr;
  nums._M_len = (size_type)params;
  nums._M_array = (iterator)0x3;
  sVar1 = _::sum((_ *)&local_58,nums);
  __return_storage_ptr__->size_ = sVar1;
  local_40 = (this->text).content.ptr;
  local_38 = 0;
  local_30 = (params_1->text).content.ptr;
  nums_00._M_len = extraout_RDX;
  nums_00._M_array = (iterator)0x3;
  sVar1 = _::sum((_ *)&local_40,nums_00);
  heapString((String *)&local_58,sVar1);
  Array<char>::operator=(&(__return_storage_ptr__->text).content,(Array<char> *)&local_58);
  Array<char>::~Array((Array<char> *)&local_58);
  local_40 = (char *)0x0;
  local_38 = 1;
  local_30 = (char *)0x0;
  nums_01._M_len = extraout_RDX_00;
  nums_01._M_array = (iterator)0x3;
  sVar1 = _::sum((_ *)&local_40,nums_01);
  local_58.ptr = _::HeapArrayDisposer::allocate<kj::StringTree::Branch>(sVar1);
  local_58.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_58.size_ = sVar1;
  Array<kj::StringTree::Branch>::operator=(&__return_storage_ptr__->branches,&local_58);
  Array<kj::StringTree::Branch>::~Array(&local_58);
  pos = (char *)(__return_storage_ptr__->text).content.size_;
  if (pos != (char *)0x0) {
    pos = (__return_storage_ptr__->text).content.ptr;
  }
  fill<kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pos,0,(ArrayPtr<const_char> *)this,(StringTree *)params,
             (ArrayPtr<const_char> *)params_1);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}